

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

bool FIX::Message::isTrailerField(int field,DataDictionary *pD)

{
  bool bVar1;
  DataDictionary *pD_local;
  int field_local;
  
  bVar1 = isTrailerField(field);
  if (bVar1) {
    pD_local._7_1_ = true;
  }
  else if (pD == (DataDictionary *)0x0) {
    pD_local._7_1_ = false;
  }
  else {
    pD_local._7_1_ = DataDictionary::isTrailerField(pD,field);
  }
  return pD_local._7_1_;
}

Assistant:

bool Message::isTrailerField(int field, const DataDictionary *pD) {
  if (isTrailerField(field)) {
    return true;
  }
  if (pD) {
    return pD->isTrailerField(field);
  }
  return false;
}